

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O0

double PID_control(double z_bar,double z_bar_prev,double z,double dz,double *piz,
                  double direction_coef,double dt,double Kp,double Kd,double Ki,double up_max,
                  double ud_max,double ui_max,double u_min,double u_max,double error_min,
                  double error_max,double dz_max)

{
  uchar *tbs;
  size_t *in_RDX;
  size_t *siglen;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *siglen_00;
  size_t *extraout_RDX_01;
  size_t *extraout_RDX_02;
  size_t *psVar1;
  size_t *siglen_01;
  uchar *in_RSI;
  EVP_PKEY_CTX *pEVar2;
  size_t in_R8;
  double dVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar4;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_70;
  double integral;
  double derivative;
  double error;
  double u;
  double Kd_local;
  double Kp_local;
  double dt_local;
  double direction_coef_local;
  double *piz_local;
  double dz_local;
  double z_local;
  double z_bar_prev_local;
  double z_bar_local;
  
  dVar3 = z_bar - z;
  tbs = (uchar *)0x8000000000000000;
  local_70 = *piz;
  if ((z_bar != z_bar_prev) || (NAN(z_bar) || NAN(z_bar_prev))) {
    local_70 = 0.0;
  }
  if (dVar3 <= error_max) {
    if (error_min <= dVar3) {
      pEVar2 = (EVP_PKEY_CTX *)piz;
      if (ABS(Kp * dVar3) <= up_max) {
        sign((EVP_PKEY_CTX *)piz,in_RSI,in_RDX,(uchar *)0x8000000000000000,in_R8);
        dVar4 = extraout_XMM0_Qa_03 * Kp * dVar3;
        psVar1 = extraout_RDX_00;
      }
      else {
        sign((EVP_PKEY_CTX *)piz,in_RSI,in_RDX,(uchar *)0x8000000000000000,in_R8);
        sign(pEVar2,in_RSI,siglen,tbs,in_R8);
        dVar4 = extraout_XMM0_Qa_01 * extraout_XMM0_Qa_02 * up_max;
        psVar1 = extraout_RDX;
      }
      error = dVar4 + 0.0;
      if (ABS((Kd * -dz) / dz_max) <= ud_max) {
        sign(pEVar2,in_RSI,psVar1,tbs,in_R8);
        dVar4 = (extraout_XMM0_Qa_06 * Kd * -dz) / dz_max;
        psVar1 = extraout_RDX_02;
      }
      else {
        sign(pEVar2,in_RSI,psVar1,tbs,in_R8);
        sign(pEVar2,in_RSI,siglen_00,tbs,in_R8);
        dVar4 = extraout_XMM0_Qa_04 * extraout_XMM0_Qa_05 * ud_max;
        psVar1 = extraout_RDX_01;
      }
      error = dVar4 + error;
      if (ABS(Ki * local_70) <= ui_max) {
        sign(pEVar2,in_RSI,psVar1,tbs,in_R8);
        dVar4 = extraout_XMM0_Qa_09 * Ki * local_70;
      }
      else {
        sign(pEVar2,in_RSI,psVar1,tbs,in_R8);
        sign(pEVar2,in_RSI,siglen_01,tbs,in_R8);
        dVar4 = extraout_XMM0_Qa_07 * extraout_XMM0_Qa_08 * ui_max;
      }
      error = dVar4 + error;
      local_70 = dVar3 * dt + local_70;
    }
    else {
      sign((EVP_PKEY_CTX *)piz,in_RSI,in_RDX,(uchar *)0x8000000000000000,in_R8);
      error = extraout_XMM0_Qa_00 * u_min;
      local_70 = 0.0;
    }
  }
  else {
    sign((EVP_PKEY_CTX *)piz,in_RSI,in_RDX,(uchar *)0x8000000000000000,in_R8);
    error = extraout_XMM0_Qa * u_max;
    local_70 = 0.0;
  }
  if (u_min <= error) {
    if (error <= u_max) {
      local_98 = error;
    }
    else {
      local_98 = u_max;
    }
    local_90 = local_98;
  }
  else {
    local_90 = u_min;
  }
  *piz = local_70;
  return local_90;
}

Assistant:

inline double PID_control(double z_bar, double z_bar_prev, double z, double dz, double* piz, double direction_coef, double dt,
	double Kp, double Kd, double Ki, double up_max, double ud_max, double ui_max,
	double u_min, double u_max, double error_min, double error_max, double dz_max)
{
	double u = 0;
	double error = z_bar-z;
	double derivative = -dz;
	double integral = *piz;
	if (z_bar != z_bar_prev) integral = 0;
	if (error > error_max)
	{
		u = sign(direction_coef, 0)*u_max;
		integral = 0;
	}
	else if (error < error_min)
	{
		u = sign(direction_coef, 0)*u_min;
		integral = 0;
	}
	else
	{
		if (fabs(Kp*error) > up_max) u += sign(direction_coef, 0)*sign(Kp*error, 0)*up_max;
		else u += sign(direction_coef, 0)*Kp*error;
		if (fabs(Kd*derivative/dz_max) > ud_max) u += sign(direction_coef, 0)*sign(Kd*derivative/dz_max, 0)*ud_max;
		else u += sign(direction_coef, 0)*Kd*derivative/dz_max; // /dz_max to try to normalize...
		if (fabs(Ki*integral) > ui_max) u += sign(direction_coef, 0)*sign(Ki*integral, 0)*ui_max;
		else u += sign(direction_coef, 0)*Ki*integral;
		integral = integral+error*dt;
	}
	u = (u < u_min)? u_min: ((u > u_max)? u_max: u);
	*piz = integral;
	return u;
}